

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::StateRecorder::Impl::add_module_identifier
               (VkPipelineShaderStageCreateInfo *info,ScratchAllocator *alloc,VkDevice device,
               PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  VkShaderModuleCreateInfo *pVVar1;
  VkShaderModuleIdentifierEXT *pVVar2;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *pVVar3;
  bool bVar4;
  
  bVar4 = true;
  if ((gsmcii != (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0 && device != (VkDevice)0x0) &&
     (pVVar1 = find_pnext<VkShaderModuleCreateInfo>((VkStructureType)info->pNext,alloc),
     pVVar1 != (VkShaderModuleCreateInfo *)0x0)) {
    pVVar2 = ScratchAllocator::allocate_cleared<VkShaderModuleIdentifierEXT>(alloc);
    if (pVVar2 != (VkShaderModuleIdentifierEXT *)0x0) {
      pVVar2->sType = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
      (*gsmcii)(device,pVVar1,pVVar2);
      pVVar3 = ScratchAllocator::
               allocate_cleared<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(alloc);
      if (pVVar3 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
        pVVar3->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT;
        pVVar3->pIdentifier = pVVar2->identifier;
        pVVar3->identifierSize = pVVar2->identifierSize;
        pVVar3->pNext = info->pNext;
        info->pNext = pVVar3;
        return true;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool StateRecorder::Impl::add_module_identifier(
		VkPipelineShaderStageCreateInfo *info, ScratchAllocator &alloc,
		VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	if (!device || !gsmcii)
		return true;

	if (auto *module_info = find_pnext<VkShaderModuleCreateInfo>(VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,
	                                                             info->pNext))
	{
		auto *ident = alloc.allocate_cleared<VkShaderModuleIdentifierEXT>();
		if (!ident)
			return false;
		ident->sType = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
		gsmcii(device, module_info, ident);

		auto *identifier_create_info = alloc.allocate_cleared<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>();
		if (!identifier_create_info)
			return false;

		identifier_create_info->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT;
		identifier_create_info->pIdentifier = ident->identifier;
		identifier_create_info->identifierSize = ident->identifierSize;

		identifier_create_info->pNext = info->pNext;
		info->pNext = identifier_create_info;
	}

	return true;
}